

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall
ViconCGStreamIO::VBuffer::Write<unsigned_int,unsigned_int>
          (VBuffer *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *i_rValues)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  _Self local_30;
  const_iterator End;
  const_iterator It;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *i_rValues_local;
  VBuffer *this_local;
  
  sVar2 = std::
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::size(i_rValues);
  It._M_node._4_4_ = (undefined4)sVar2;
  VBufferImpl::WritePod<unsigned_int>(&this->m_BufferImpl,(uint *)((long)&It._M_node + 4));
  End = std::
        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::begin(i_rValues);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(i_rValues);
  while( true ) {
    bVar1 = std::operator!=(&End,&local_30);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                       (&End);
    Write<unsigned_int>(this,&ppVar3->first);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                       (&End);
    Write<unsigned_int>(this,&ppVar3->second);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&End);
  }
  return;
}

Assistant:

void Write( const std::map< K, V > & i_rValues )
  {
    m_BufferImpl.WritePod< ViconCGStreamType::UInt32 >( static_cast< ViconCGStreamType::UInt32 >( i_rValues.size() ) );
    
    typename std::map< K, V >::const_iterator It = i_rValues.begin();
    typename std::map< K, V >::const_iterator End = i_rValues.end();
    for( ; It != End; ++It )
    {
      Write( ( *It ).first );
      Write( ( *It ).second );
    }
  }